

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::SingularVarBigint<int,unsigned_short,true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint uVar1;
  ushort *puVar2;
  char *pcVar3;
  ulong uVar4;
  uint *puVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar6 = (ulong)*ptr;
  if (-1 < (long)uVar6) {
    protobuf_assumption_failed
              ("static_cast<int8_t>(*ptr) < 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x39f);
  }
  uVar7 = (long)ptr[1] << 7 | 0x7f;
  if ((long)uVar7 < 0) {
    uVar4 = (long)ptr[2] << 0xe | 0x3fff;
    if (-1 < (long)uVar4) {
      puVar2 = (ushort *)(ptr + 3);
LAB_0045af9a:
      uVar7 = uVar7 & uVar4;
      goto LAB_0045af9d;
    }
    uVar7 = uVar7 & ((long)ptr[3] << 0x15 | 0x1fffffU);
    if (-1 < (long)uVar7) {
      puVar2 = (ushort *)(ptr + 4);
      goto LAB_0045af9a;
    }
    uVar4 = uVar4 & ((long)ptr[4] << 0x1c | 0xfffffffU);
    if (-1 < (long)uVar4) {
      puVar2 = (ushort *)(ptr + 5);
      goto LAB_0045af9a;
    }
    uVar7 = uVar7 & ((long)ptr[5] << 0x23 | 0x7ffffffffU);
    if (-1 < (long)uVar7) {
      puVar2 = (ushort *)(ptr + 6);
      goto LAB_0045af9a;
    }
    uVar4 = uVar4 & ((long)ptr[6] << 0x2a | 0x3ffffffffffU);
    if (-1 < (long)uVar4) {
      puVar2 = (ushort *)(ptr + 7);
      goto LAB_0045af9a;
    }
    uVar7 = uVar7 & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU);
    if (-1 < (long)uVar7) {
      puVar2 = (ushort *)(ptr + 8);
      goto LAB_0045af9a;
    }
    uVar4 = uVar4 & ((ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff);
    if (-1 < (long)uVar4) {
      puVar2 = (ushort *)(ptr + 9);
      goto LAB_0045af9a;
    }
    puVar2 = (ushort *)(ptr + 10);
    if ((ptr[9] == '\x01') || (-1 < ptr[9])) goto LAB_0045af9a;
    puVar2 = (ushort *)0x0;
  }
  else {
    puVar2 = (ushort *)(ptr + 2);
LAB_0045af9d:
    uVar6 = uVar6 & uVar7;
  }
  if (puVar2 == (ushort *)0x0) {
    pcVar3 = Error(msg,(char *)0x0,ctx,data,table,hasbits);
    return pcVar3;
  }
  puVar5 = (uint *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)puVar5 & 3) == 0) {
    *puVar5 = -((uint)uVar6 & 1) ^ (uint)(uVar6 >> 1) & 0x7fffffff;
    if (puVar2 < (ctx->super_EpsCopyInputStream).limit_end_) {
      uVar1 = (uint)table->fast_idx_mask & (uint)*puVar2;
      if ((uVar1 & 7) == 0) {
        pcVar3 = (char *)(**(code **)(&table[1].has_bits_offset + (uVar1 & 0xfffffff8)))();
        return pcVar3;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    if ((ulong)table->has_bits_offset != 0) {
      puVar5 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar5 & 3) != 0) goto LAB_0045b031;
      *puVar5 = *puVar5 | (uint)hasbits;
    }
    return (char *)puVar2;
  }
LAB_0045b031:
  AlignFail(puVar5);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::SingularVarBigint(
    PROTOBUF_TC_PARAM_DECL) {
  uint64_t tmp;
  PROTOBUF_ASSUME(static_cast<int8_t>(*ptr) < 0);
  ptr = ParseVarint(ptr, &tmp);

  if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  RefAt<FieldType>(msg, data.offset()) =
      ZigZagDecodeHelper<FieldType, zigzag>(tmp);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}